

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O3

int md_ref_def_cmp_for_sort(void *a,void *b)

{
  uint uVar1;
  
  uVar1 = md_ref_def_cmp(a,b);
  if (uVar1 == 0) {
    uVar1 = 0xffffffff;
    if (*b <= *a) {
      uVar1 = (uint)(*b < *a);
    }
  }
  return uVar1;
}

Assistant:

static int
md_ref_def_cmp_for_sort(const void* a, const void* b)
{
    int cmp;

    cmp = md_ref_def_cmp(a, b);

    /* Ensure stability of the sorting. */
    if(cmp == 0) {
        const MD_REF_DEF* a_ref = *(const MD_REF_DEF**)a;
        const MD_REF_DEF* b_ref = *(const MD_REF_DEF**)b;

        if(a_ref < b_ref)
            cmp = -1;
        else if(a_ref > b_ref)
            cmp = +1;
        else
            cmp = 0;
    }

    return cmp;
}